

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O0

Vector3f __thiscall pbrt::Frame::FromLocal(Frame *this,Vector3f *v)

{
  undefined8 uVar1;
  Tuple3<pbrt::Vector3,_float> TVar2;
  undefined1 auVar8 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  Vector3<float> VVar9;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  Tuple3<pbrt::Vector3,_float> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined8 in_stack_ffffffffffffff60;
  float s;
  
  s = (float)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  auVar8 = (undefined1  [56])0x0;
  VVar9 = pbrt::operator*(s,(Tuple3<pbrt::Vector3,_float> *)
                            CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  auVar3._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar8;
  vmovlpd_avx(auVar3._0_16_);
  auVar8 = (undefined1  [56])0x0;
  VVar9 = pbrt::operator*(s,(Tuple3<pbrt::Vector3,_float> *)
                            CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  auVar4._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar8;
  vmovlpd_avx(auVar4._0_16_);
  VVar9 = Tuple3<pbrt::Vector3,float>::operator+
                    (in_stack_ffffffffffffff50,
                     (Vector3<float> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                    );
  auVar5._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar8;
  vmovlpd_avx(auVar5._0_16_);
  auVar8 = (undefined1  [56])0x0;
  VVar9 = pbrt::operator*(s,(Tuple3<pbrt::Vector3,_float> *)
                            CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  auVar6._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar8;
  vmovlpd_avx(auVar6._0_16_);
  VVar9 = Tuple3<pbrt::Vector3,float>::operator+
                    (in_stack_ffffffffffffff50,
                     (Vector3<float> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                    );
  auVar7._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar8;
  uVar1 = vmovlpd_avx(auVar7._0_16_);
  TVar2.z = VVar9.super_Tuple3<pbrt::Vector3,_float>.z;
  TVar2.x = (float)(int)uVar1;
  TVar2.y = (float)(int)((ulong)uVar1 >> 0x20);
  return (Vector3f)TVar2;
}

Assistant:

PBRT_CPU_GPU
    Vector3f FromLocal(const Vector3f &v) const { return v.x * x + v.y * y + v.z * z; }